

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lasindex.cpp
# Opt level: O0

ssize_t __thiscall LASindex::read(LASindex *this,int __fd,void *__buf,size_t __nbytes)

{
  BOOL BVar1;
  ulong uVar2;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *__buf_00;
  undefined4 in_register_00000034;
  FILE *file;
  undefined8 local_28;
  ByteStreamIn *stream;
  FILE *file_local;
  LASindex *this_local;
  
  file = (FILE *)CONCAT44(in_register_00000034,__fd);
  if (file == (FILE *)0x0) {
    this_local._7_1_ = 0;
  }
  else {
    BVar1 = IS_LITTLE_ENDIAN();
    if (BVar1) {
      local_28 = (LASindex *)operator_new(0x28);
      ByteStreamInFileLE::ByteStreamInFileLE((ByteStreamInFileLE *)local_28,file);
      __buf_00 = extraout_RDX;
    }
    else {
      local_28 = (LASindex *)operator_new(0x28);
      ByteStreamInFileBE::ByteStreamInFileBE((ByteStreamInFileBE *)local_28,file);
      __buf_00 = extraout_RDX_00;
    }
    uVar2 = read(this,(int)local_28,__buf_00,__nbytes);
    if ((uVar2 & 1) == 0) {
      this = local_28;
      if (local_28 != (LASindex *)0x0) {
        this = (LASindex *)(**(code **)(*(long *)local_28 + 0x70))();
      }
      this_local._7_1_ = 0;
    }
    else {
      if (local_28 != (LASindex *)0x0) {
        local_28 = (LASindex *)(**(code **)(*(long *)local_28 + 0x70))();
      }
      this_local._7_1_ = 1;
      this = local_28;
    }
  }
  return CONCAT71((int7)((ulong)this >> 8),this_local._7_1_);
}

Assistant:

BOOL LASindex::read(FILE* file)
{
  if (file == 0) return FALSE;
  ByteStreamIn* stream;
  if (IS_LITTLE_ENDIAN())
    stream = new ByteStreamInFileLE(file);
  else
    stream = new ByteStreamInFileBE(file);
  if (!read(stream))
  {
    delete stream;
    return FALSE;
  }
  delete stream;
  return TRUE;
}